

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double coupon_complete_pdf(int type_num,int box_num)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  
  if (0 < type_num && -1 < box_num) {
    if (type_num == 1) {
      if (box_num == 1) {
        return 1.0;
      }
    }
    else if ((uint)type_num <= (uint)box_num) {
      dVar5 = 1.0;
      dVar4 = 1.0;
      iVar1 = type_num;
      while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, iVar2 = type_num, bVar3) {
        dVar5 = (dVar5 * dVar4) / (double)type_num;
        dVar4 = dVar4 + 1.0;
      }
      for (; iVar2 < box_num; iVar2 = iVar2 + 1) {
        dVar5 = dVar5 / (double)type_num;
      }
      iVar1 = stirling2_value(box_num + -1,type_num + -1);
      return dVar5 * (double)iVar1;
    }
  }
  return 0.0;
}

Assistant:

double coupon_complete_pdf ( int type_num, int box_num )

//****************************************************************************80
//
//  Purpose:
//
//    COUPON_COMPLETE_PDF evaluates the Complete Coupon Collection PDF.
//
//  Discussion:
//
//    PDF(TYPE_NUM;BOX_NUM) is the probability that, given an inexhaustible
//    supply of boxes, inside each of which there is one of TYPE_NUM distinct
//    coupons, which are uniformly distributed among the boxes, that it will
//    require opening exactly BOX_NUM boxes to achieve at least one of each
//    kind of coupon.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    25 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Herbert Wilf,
//    Some New Aspects of the Coupon Collector's Problem,
//    SIAM Review,
//    Volume 48, Number 3, September 2006, pages 549-565.
//
//  Parameters:
//
//    Input, int BOX_NUM, the number of boxes that had to be opened
//    in order to just get at least one of each coupon.
//    0 <= BOX_NUM.  If BOX_NUM < TYPE_NUM, then PDF is surely 0.
//
//    Input, int TYPE_NUM, the number of distinct coupons.
//    1 <= TYPE_NUM.
//
//    Output, double COUPON_COMPLETE_PDF, the value of the PDF.
//
{
  double factor;
  int i;
  double pdf;
//
//  Nonsense cases.
//
  if ( box_num < 0 )
  {
    pdf = 0.0;
  }
  else if ( type_num < 1 )
  {
    pdf = 0.0;
  }
//
//  Degenerate but meaningful case.
//
  else if ( type_num == 1 )
  {
    if ( box_num == 1 )
    {
      pdf = 1.0;
    }
    else
    {
      pdf = 0.0;
    }
  }
//
//  Easy cases.
//
  else if ( box_num < type_num )
  {
    pdf = 0.0;
  }
//
//  General case.
//
  else
  {
    factor = 1.0;
    for ( i = 1; i <= type_num; i++ )
    {
      factor = factor * static_cast<double>(i ) / static_cast<double>(type_num );
    }
    for ( i = type_num+1; i <= box_num; i++ )
    {
      factor = factor / static_cast<double>(type_num );
    }
    pdf = factor * static_cast< double >( stirling2_value ( box_num-1, type_num-1 ) );
  }
  return pdf;
}